

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FsmCollection.hpp
# Opt level: O2

vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
* __thiscall
peach::fsm::FsmCollection::tokenizeText
          (vector<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
           *__return_storage_ptr__,FsmCollection *this,string *text,
          vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
          *reservedKeywords)

{
  size_type sVar1;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  pointer puVar2;
  pointer ppVar3;
  __type _Var4;
  type *keyword;
  pointer __rhs;
  unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_> *token;
  pointer puVar5;
  vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
  *__range3;
  anon_class_16_2_551b5595 __f;
  anon_class_16_2_551b5595 processChar;
  anon_class_16_2_551b5595 local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  sVar1 = text->_M_string_length;
  if (sVar1 == 0) {
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  }
  else {
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
    )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
    )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    (__return_storage_ptr__->
    super__Vector_base<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
    )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    __first._M_current = (text->_M_dataplus)._M_p;
    __f.tokens = __return_storage_ptr__;
    __f.this = this;
    local_60.this = this;
    local_60.tokens = __return_storage_ptr__;
    std::
    for_each<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,peach::fsm::FsmCollection::tokenizeText(std::__cxx11::string_const&,std::vector<std::pair<std::__cxx11::string,unsigned_long>,std::allocator<std::pair<std::__cxx11::string,unsigned_long>>>const&)::_lambda(char)_1_>
              (__first,(__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        )(__first._M_current + sVar1),__f);
    tokenizeText::anon_class_16_2_551b5595::operator()(&local_60,'\0');
    puVar2 = (__return_storage_ptr__->
             super__Vector_base<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (puVar5 = (__return_storage_ptr__->
                  super__Vector_base<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>,_std::allocator<std::unique_ptr<peach::token::Token,_std::default_delete<peach::token::Token>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar2; puVar5 = puVar5 + 1)
    {
      ppVar3 = (reservedKeywords->
               super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      for (__rhs = (reservedKeywords->
                   super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                   )._M_impl.super__Vector_impl_data._M_start; __rhs != ppVar3; __rhs = __rhs + 1) {
        std::__cxx11::string::string
                  ((string *)&local_50,
                   (string *)
                   &((puVar5->_M_t).
                     super___uniq_ptr_impl<peach::token::Token,_std::default_delete<peach::token::Token>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_peach::token::Token_*,_std::default_delete<peach::token::Token>_>
                     .super__Head_base<0UL,_peach::token::Token_*,_false>._M_head_impl)->token_);
        _Var4 = std::operator==(&local_50,&__rhs->first);
        std::__cxx11::string::~string((string *)&local_50);
        if (_Var4) {
          ((puVar5->_M_t).
           super___uniq_ptr_impl<peach::token::Token,_std::default_delete<peach::token::Token>_>.
           _M_t.
           super__Tuple_impl<0UL,_peach::token::Token_*,_std::default_delete<peach::token::Token>_>.
           super__Head_base<0UL,_peach::token::Token_*,_false>._M_head_impl)->category_ =
               __rhs->second;
        }
      }
    }
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<std::unique_ptr<token::Token>> tokenizeText(const std::string &text,
                                                            const std::vector<std::pair<std::string, token::tokenCategory_t>> &reservedKeywords)
    {
        if (text.empty())
        {
            return {};
        }
        std::vector<std::unique_ptr<token::Token>> tokens;
        auto processChar = [&](char c) {
            pushNextChar(c, tokens);
        };
        std::for_each(text.begin(), text.end(), processChar);
        processChar('\0');
        for (const auto &token : tokens)
        {
            for (const auto &[keyword, category] : reservedKeywords)
            {
                if (token->getTokenString() == keyword)
                {
                    token->setCategory(category);
                }
            }
        }
        return tokens;
    }